

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MatchesClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MatchesClauseSyntax,slang::parsing::Token&,slang::syntax::PatternSyntax&>
          (BumpAllocator *this,Token *args,PatternSyntax *args_1)

{
  Token matchesKeyword;
  MatchesClauseSyntax *this_00;
  
  this_00 = (MatchesClauseSyntax *)allocate(this,0x28,8);
  matchesKeyword.kind = args->kind;
  matchesKeyword._2_1_ = args->field_0x2;
  matchesKeyword.numFlags.raw = (args->numFlags).raw;
  matchesKeyword.rawLen = args->rawLen;
  matchesKeyword.info = args->info;
  slang::syntax::MatchesClauseSyntax::MatchesClauseSyntax(this_00,matchesKeyword,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }